

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O1

void __thiscall Dialog::draw(Dialog *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  int ch;
  int cw;
  int cy;
  int cx;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  
  al_get_clipping_rectangle(&local_24,&local_28,&local_2c,&local_30);
  for (p_Var2 = (this->all_widgets).super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->all_widgets; p_Var2 = p_Var2->_M_next) {
    p_Var1 = p_Var2[1]._M_next;
    al_set_clipping_rectangle
              (*(int *)&p_Var1[2]._M_next,*(int *)((long)(p_Var1 + 2) + 4),
               (*(int *)((long)(p_Var1 + 2) + 8) - *(int *)&p_Var1[2]._M_next) + 1,
               (*(int *)((long)(p_Var1 + 2) + 0xc) - *(int *)((long)(p_Var1 + 2) + 4)) + 1);
    (**(code **)((long)p_Var1->_M_next + 0x70))(p_Var1);
  }
  al_set_clipping_rectangle(local_24,local_28,local_2c,local_30);
  this->draw_requested = false;
  return;
}

Assistant:

void Dialog::draw()
{
   int cx, cy, cw, ch;
   al_get_clipping_rectangle(&cx, &cy, &cw, &ch);

   for (std::list<Widget *>::iterator it = this->all_widgets.begin();
         it != this->all_widgets.end();
         ++it)
   {
      Widget *wid = (*it);
      al_set_clipping_rectangle(wid->x1, wid->y1, wid->width(), wid->height());
      wid->draw();
   }

   al_set_clipping_rectangle(cx, cy, cw, ch);

   this->draw_requested = false;
}